

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O3

void __thiscall OpenMesh::IO::_PLYReader_::_PLYReader_(_PLYReader_ *this)

{
  map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  _IOManager_ *this_01;
  mapped_type_conflict *pmVar2;
  _PLYReader_ *local_28;
  
  (this->super_BaseReader)._vptr_BaseReader = (_func_int **)&PTR___PLYReader__001c2160;
  this->options_ = 0;
  this->userOptions_ = 0;
  this_00 = &this->scalar_size_;
  p_Var1 = &(this->scalar_size_)._M_t._M_impl.super__Rb_tree_header;
  (this->scalar_size_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->scalar_size_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->scalar_size_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->scalar_size_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->scalar_size_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->vertexPropertyMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->vertexPropertyMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->vertexPropertyMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->vertexPropertyMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->vertexPropertyMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->vertexPropertyMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_01 = IOManager();
  local_28 = this;
  std::
  _Rb_tree<OpenMesh::IO::BaseReader*,OpenMesh::IO::BaseReader*,std::_Identity<OpenMesh::IO::BaseReader*>,std::less<OpenMesh::IO::BaseReader*>,std::allocator<OpenMesh::IO::BaseReader*>>
  ::_M_insert_unique<OpenMesh::IO::BaseReader*const&>
            ((_Rb_tree<OpenMesh::IO::BaseReader*,OpenMesh::IO::BaseReader*,std::_Identity<OpenMesh::IO::BaseReader*>,std::less<OpenMesh::IO::BaseReader*>,std::allocator<OpenMesh::IO::BaseReader*>>
              *)this_01,(BaseReader **)&local_28);
  _IOManager_::update_read_filters(this_01);
  local_28._0_4_ = 1;
  pmVar2 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](this_00,(key_type *)&local_28);
  *pmVar2 = 1;
  local_28._0_4_ = 3;
  pmVar2 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](this_00,(key_type *)&local_28);
  *pmVar2 = 1;
  local_28._0_4_ = 5;
  pmVar2 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](this_00,(key_type *)&local_28);
  *pmVar2 = 2;
  local_28._0_4_ = 7;
  pmVar2 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](this_00,(key_type *)&local_28);
  *pmVar2 = 2;
  local_28._0_4_ = 9;
  pmVar2 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](this_00,(key_type *)&local_28);
  *pmVar2 = 4;
  local_28._0_4_ = 0xb;
  pmVar2 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](this_00,(key_type *)&local_28);
  *pmVar2 = 4;
  local_28._0_4_ = 0xd;
  pmVar2 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](this_00,(key_type *)&local_28);
  *pmVar2 = 4;
  local_28._0_4_ = 0xf;
  pmVar2 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](this_00,(key_type *)&local_28);
  *pmVar2 = 8;
  local_28._0_4_ = 2;
  pmVar2 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](this_00,(key_type *)&local_28);
  *pmVar2 = 1;
  local_28._0_4_ = 4;
  pmVar2 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](this_00,(key_type *)&local_28);
  *pmVar2 = 1;
  local_28._0_4_ = 6;
  pmVar2 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](this_00,(key_type *)&local_28);
  *pmVar2 = 2;
  local_28._0_4_ = 8;
  pmVar2 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](this_00,(key_type *)&local_28);
  *pmVar2 = 2;
  local_28._0_4_ = 10;
  pmVar2 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](this_00,(key_type *)&local_28);
  *pmVar2 = 4;
  local_28._0_4_ = 0xc;
  pmVar2 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](this_00,(key_type *)&local_28);
  *pmVar2 = 4;
  local_28._0_4_ = 0xe;
  pmVar2 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](this_00,(key_type *)&local_28);
  *pmVar2 = 4;
  local_28 = (_PLYReader_ *)CONCAT44(local_28._4_4_,0x10);
  pmVar2 = std::
           map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
           ::operator[](this_00,(key_type *)&local_28);
  *pmVar2 = 8;
  return;
}

Assistant:

_PLYReader_::_PLYReader_() {
    IOManager().register_module(this);

    // Store sizes in byte of each property type
    scalar_size_[ValueTypeINT8] = 1;
    scalar_size_[ValueTypeUINT8] = 1;
    scalar_size_[ValueTypeINT16] = 2;
    scalar_size_[ValueTypeUINT16] = 2;
    scalar_size_[ValueTypeINT32] = 4;
    scalar_size_[ValueTypeUINT32] = 4;
    scalar_size_[ValueTypeFLOAT32] = 4;
    scalar_size_[ValueTypeFLOAT64] = 8;

    scalar_size_[ValueTypeCHAR] = 1;
    scalar_size_[ValueTypeUCHAR] = 1;
    scalar_size_[ValueTypeSHORT] = 2;
    scalar_size_[ValueTypeUSHORT] = 2;
    scalar_size_[ValueTypeINT] = 4;
    scalar_size_[ValueTypeUINT] = 4;
    scalar_size_[ValueTypeFLOAT] = 4;
    scalar_size_[ValueTypeDOUBLE] = 8;
}